

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O1

uint32_t helper_atomic_cmpxchgl_le_s390x
                   (CPUArchState_conflict29 *env,target_ulong addr,uint32_t cmpv,uint32_t newv,
                   TCGMemOpIdx oi)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uintptr_t unaff_retaddr;
  
  puVar2 = (uint32_t *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  LOCK();
  uVar1 = *puVar2;
  if (cmpv == uVar1) {
    *puVar2 = newv;
    uVar1 = cmpv;
  }
  UNLOCK();
  return uVar1;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}